

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O3

void TrainModel(void)

{
  int *piVar1;
  longlong lVar2;
  int iVar3;
  pthread_t *__ptr;
  FILE *__stream;
  void *__ptr_00;
  void *__s;
  real *prVar4;
  FILE *__stream_00;
  ulong uVar5;
  long lVar6;
  long extraout_RDX;
  long lVar7;
  ulong uVar8;
  longlong lVar9;
  uint in_ESI;
  undefined4 uVar10;
  long lVar11;
  char *__s1;
  void *pvVar12;
  long lVar13;
  ulong uVar14;
  pthread_t *__newthread;
  void *pvVar15;
  longlong lVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  __s1 = (char *)((long)num_threads << 3);
  __ptr = (pthread_t *)malloc((size_t)__s1);
  if (__ptr == (pthread_t *)0x0) {
    TrainModel_cold_3();
  }
  else {
    printf("Starting training using file %s\n");
    starting_alpha = alpha;
    if (read_vocab_file[0] == '\0') {
      LearnVocabFromTrainFile();
    }
    else {
      ReadVocab();
    }
    if (save_vocab_file[0] != '\0') {
      SaveVocab();
    }
    if (output_file[0] == '\0') {
      return;
    }
    InitNet();
    if (0 < negative) {
      InitUnigramTable();
    }
    puts("Starting to learn");
    start = clock();
    if (0 < num_threads) {
      pvVar15 = (void *)0x0;
      __newthread = __ptr;
      do {
        pthread_create(__newthread,(pthread_attr_t *)0x0,TrainModelThread,pvVar15);
        pvVar15 = (void *)((long)pvVar15 + 1);
        __newthread = __newthread + 1;
      } while ((long)pvVar15 < (long)num_threads);
      if (0 < num_threads) {
        lVar7 = 0;
        do {
          pthread_join(__ptr[lVar7],(void **)0x0);
          lVar7 = lVar7 + 1;
        } while (lVar7 < num_threads);
      }
    }
    __s1 = output_file;
    in_ESI = 0x1060ff;
    __stream = fopen(output_file,"wb");
    lVar2 = classes;
    if (__stream != (FILE *)0x0) {
      if (classes == 0) {
        fprintf(__stream,"%lld %lld\n",vocab_size,layer1_size);
        if (0 < vocab_size) {
          lVar7 = 0;
          lVar6 = 0;
          do {
            if (vocab[lVar6].word != (char *)0x0) {
              fprintf(__stream,"%s ");
            }
            if (binary == 0) {
              if (0 < layer1_size) {
                lVar11 = 0;
                do {
                  fprintf(__stream,"%lf ",
                          (double)*(float *)((long)syn0 + lVar11 * 4 + layer1_size * lVar7));
                  lVar11 = lVar11 + 1;
                } while (lVar11 < layer1_size);
              }
            }
            else if (0 < layer1_size) {
              lVar13 = 0;
              lVar11 = 0;
              do {
                fwrite((void *)((long)syn0 + lVar13 + layer1_size * lVar7),4,1,__stream);
                lVar11 = lVar11 + 1;
                lVar13 = lVar13 + 4;
              } while (lVar11 < layer1_size);
            }
            fputc(10,__stream);
            lVar6 = lVar6 + 1;
            lVar7 = lVar7 + 4;
          } while (lVar6 < vocab_size);
        }
        if (hs != 0) {
          __stream_00 = fopen(output_classifier,"ab");
          if (0 < vocab_size) {
            lVar7 = 0;
            lVar6 = 0;
            do {
              if (binary == 0) {
                if (0 < layer1_size) {
                  lVar11 = 0;
                  do {
                    fprintf(__stream_00,"%lf ",
                            (double)*(float *)((long)syn1 + lVar11 * 4 + layer1_size * lVar7));
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < layer1_size);
                }
                fputc(10,__stream_00);
              }
              else if (0 < layer1_size) {
                lVar13 = 0;
                lVar11 = 0;
                do {
                  fwrite((void *)((long)syn1 + lVar13 + layer1_size * lVar7),4,1,__stream_00);
                  lVar11 = lVar11 + 1;
                  lVar13 = lVar13 + 4;
                } while (lVar11 < layer1_size);
              }
              lVar6 = lVar6 + 1;
              lVar7 = lVar7 + 4;
            } while (lVar6 < vocab_size);
          }
          fclose(__stream_00);
        }
LAB_00104995:
        fclose(__stream);
        free(table);
        free(__ptr);
        DestroyVocab();
        return;
      }
      __s1 = (char *)(classes * 4);
      pvVar15 = malloc((size_t)__s1);
      lVar9 = vocab_size;
      if (pvVar15 != (void *)0x0) {
        __ptr_00 = calloc(vocab_size,4);
        lVar16 = layer1_size;
        __s = calloc(layer1_size * lVar2,4);
        auVar26 = _DAT_00106070;
        auVar27 = _DAT_00106050;
        uVar8 = (ulong)(int)lVar2;
        if (0 < lVar9) {
          lVar7 = lVar9 + -1;
          auVar18._8_4_ = (int)lVar7;
          auVar18._0_8_ = lVar7;
          auVar18._12_4_ = (int)((ulong)lVar7 >> 0x20);
          uVar5 = 0;
          auVar18 = auVar18 ^ _DAT_00106050;
          auVar23 = _DAT_00106040;
          do {
            auVar25 = auVar23 ^ auVar27;
            if ((bool)(~(auVar25._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar25._0_4_ ||
                        auVar18._4_4_ < auVar25._4_4_) & 1)) {
              *(int *)((long)__ptr_00 + uVar5 * 4) = (int)((long)uVar5 % (long)uVar8);
            }
            if ((auVar25._12_4_ != auVar18._12_4_ || auVar25._8_4_ <= auVar18._8_4_) &&
                auVar25._12_4_ <= auVar18._12_4_) {
              *(int *)((long)__ptr_00 + uVar5 * 4 + 4) = (int)((long)(uVar5 + 1) % (long)uVar8);
            }
            uVar5 = uVar5 + 2;
            lVar7 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + auVar26._0_8_;
            auVar23._8_8_ = lVar7 + auVar26._8_8_;
          } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar5);
        }
        lVar7 = uVar8 - 1;
        auVar26._8_4_ = (int)lVar7;
        auVar26._0_8_ = lVar7;
        auVar26._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar7 = 0;
        auVar26 = auVar26 ^ _DAT_00106050;
        auVar27 = _DAT_00106050;
        do {
          while( true ) {
            if (0 < (long)(lVar16 * uVar8)) {
              memset(__s,0,((lVar2 << 0x20) >> 0x1e) * lVar16);
              auVar27 = _DAT_00106050;
            }
            if (0 < (long)uVar8) {
              uVar5 = 0;
              auVar25 = _DAT_00106040;
              auVar20 = _DAT_00106080;
              do {
                auVar23 = auVar25 ^ auVar27;
                iVar3 = auVar26._4_4_;
                if ((bool)(~(auVar23._4_4_ == iVar3 && auVar26._0_4_ < auVar23._0_4_ ||
                            iVar3 < auVar23._4_4_) & 1)) {
                  *(undefined4 *)((long)pvVar15 + uVar5 * 4) = 1;
                }
                if ((auVar23._12_4_ != auVar26._12_4_ || auVar23._8_4_ <= auVar26._8_4_) &&
                    auVar23._12_4_ <= auVar26._12_4_) {
                  *(undefined4 *)((long)pvVar15 + uVar5 * 4 + 4) = 1;
                }
                iVar24 = SUB164(auVar20 ^ auVar27,4);
                if (iVar24 <= iVar3 &&
                    (iVar24 != iVar3 || SUB164(auVar20 ^ auVar27,0) <= auVar26._0_4_)) {
                  *(undefined4 *)((long)pvVar15 + uVar5 * 4 + 8) = 1;
                  *(undefined4 *)((long)pvVar15 + uVar5 * 4 + 0xc) = 1;
                }
                uVar5 = uVar5 + 4;
                lVar6 = auVar25._8_8_;
                auVar25._0_8_ = auVar25._0_8_ + (long)DAT_00106090;
                auVar25._8_8_ = lVar6 + DAT_00106090._8_8_;
                lVar6 = auVar20._8_8_;
                auVar20._0_8_ = auVar20._0_8_ + (long)DAT_00106090;
                auVar20._8_8_ = lVar6 + DAT_00106090._8_8_;
              } while ((uVar8 + 3 & 0x7ffffffffffffffc) != uVar5);
            }
            if (0 < lVar9) {
              lVar6 = 0;
              prVar4 = syn0;
              do {
                if (lVar16 < 1) {
                  lVar11 = (long)*(int *)((long)__ptr_00 + lVar6 * 4);
                }
                else {
                  lVar11 = (long)*(int *)((long)__ptr_00 + lVar6 * 4);
                  lVar13 = 0;
                  do {
                    *(float *)((long)__s + lVar13 * 4 + lVar16 * lVar11 * 4) =
                         prVar4[lVar13] + *(float *)((long)__s + lVar13 * 4 + lVar16 * lVar11 * 4);
                    lVar13 = lVar13 + 1;
                  } while (lVar16 != lVar13);
                }
                piVar1 = (int *)((long)pvVar15 + lVar11 * 4);
                *piVar1 = *piVar1 + 1;
                lVar6 = lVar6 + 1;
                prVar4 = prVar4 + lVar16;
              } while (lVar6 != lVar9);
            }
            if (0 < (long)uVar8) {
              lVar6 = 0;
              uVar5 = 0;
              do {
                if (lVar16 < 1) {
                  fVar17 = 0.0;
                }
                else {
                  iVar3 = *(int *)((long)pvVar15 + uVar5 * 4);
                  fVar17 = 0.0;
                  lVar11 = 0;
                  do {
                    fVar22 = *(float *)((long)__s + lVar11 * 4 + lVar16 * lVar6) / (float)iVar3;
                    *(float *)((long)__s + lVar11 * 4 + lVar16 * lVar6) = fVar22;
                    fVar17 = fVar17 + fVar22 * fVar22;
                    lVar11 = lVar11 + 1;
                  } while (lVar16 != lVar11);
                }
                if (fVar17 < 0.0) {
                  fVar17 = sqrtf(fVar17);
                  auVar27 = _DAT_00106050;
                }
                else {
                  fVar17 = SQRT(fVar17);
                }
                lVar16 = layer1_size;
                if (0 < layer1_size) {
                  lVar11 = layer1_size * lVar6;
                  lVar13 = 0;
                  do {
                    *(float *)((long)__s + lVar13 * 4 + lVar11) =
                         *(float *)((long)__s + lVar13 * 4 + lVar11) / fVar17;
                    lVar13 = lVar13 + 1;
                  } while (lVar16 != lVar13);
                }
                uVar5 = uVar5 + 1;
                lVar6 = lVar6 + 4;
                lVar9 = vocab_size;
              } while (uVar5 != uVar8);
            }
            if (lVar9 < 1) break;
            lVar6 = 0;
            prVar4 = syn0;
            do {
              uVar5 = 0;
              uVar10 = 0;
              if (0 < (long)uVar8) {
                auVar19._0_12_ = ZEXT812(0xc1200000);
                auVar19._12_4_ = 0;
                uVar14 = 0;
                pvVar12 = __s;
                do {
                  auVar21 = ZEXT816(0);
                  if (0 < lVar16) {
                    lVar11 = 0;
                    do {
                      auVar21._0_4_ =
                           auVar21._0_4_ + *(float *)((long)pvVar12 + lVar11 * 4) * prVar4[lVar11];
                      lVar11 = lVar11 + 1;
                    } while (lVar16 != lVar11);
                  }
                  fVar17 = auVar19._0_4_;
                  if (fVar17 < auVar21._0_4_) {
                    uVar5 = uVar14 & 0xffffffff;
                    auVar19 = auVar21;
                  }
                  else {
                    auVar19._4_12_ = auVar21._4_12_;
                    auVar19._0_4_ = fVar17;
                  }
                  uVar10 = (undefined4)uVar5;
                  uVar14 = uVar14 + 1;
                  pvVar12 = (void *)((long)pvVar12 + lVar16 * 4);
                } while (uVar14 != uVar8);
              }
              *(undefined4 *)((long)__ptr_00 + lVar6 * 4) = uVar10;
              lVar6 = lVar6 + 1;
              prVar4 = prVar4 + lVar16;
            } while (lVar6 != lVar9);
            lVar7 = lVar7 + 1;
            if (lVar7 == 10) {
              if (0 < lVar9) {
                lVar7 = 4;
                lVar6 = 0;
                do {
                  fprintf(__stream,"%s %d\n",*(undefined8 *)((long)&vocab->cn + lVar7 * 4),
                          (ulong)*(uint *)((long)__ptr_00 + lVar6 * 4));
                  lVar6 = lVar6 + 1;
                  lVar7 = lVar7 + 10;
                } while (lVar6 < vocab_size);
              }
              goto LAB_00104771;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 10);
LAB_00104771:
        free(pvVar15);
        free(__s);
        free(__ptr_00);
        goto LAB_00104995;
      }
      goto LAB_001049d0;
    }
  }
  TrainModel_cold_2();
LAB_001049d0:
  TrainModel_cold_1();
  if (1 < (int)in_ESI) {
    uVar8 = (ulong)in_ESI;
    lVar7 = 1;
    do {
      iVar3 = strcmp(__s1,*(char **)(extraout_RDX + lVar7 * 8));
      if (iVar3 == 0) {
        if ((int)uVar8 != 2) {
          return;
        }
        printf("Argument missing for %s\n",__s1);
        exit(1);
      }
      lVar7 = lVar7 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 1);
  }
  return;
}

Assistant:

void TrainModel() {
  long a, b, c, d;
  FILE *fo;
  pthread_t *pt = (pthread_t *)malloc(num_threads * sizeof(pthread_t));
  if (pt == NULL) {
    fprintf(stderr, "cannot allocate memory for threads\n");
    exit(1);
  }
  printf("Starting training using file %s\n", train_file);
  starting_alpha = alpha;
  if (read_vocab_file[0] != 0) ReadVocab(); else LearnVocabFromTrainFile();
  if (save_vocab_file[0] != 0) SaveVocab();
  if (output_file[0] == 0) return;
  InitNet();
  if (negative > 0) InitUnigramTable();
  printf("Starting to learn\n");
  start = clock();
  for (a = 0; a < num_threads; a++) pthread_create(&pt[a], NULL, TrainModelThread, (void *)a);
  for (a = 0; a < num_threads; a++) pthread_join(pt[a], NULL);
  fo = fopen(output_file, "wb");
  if (fo == NULL) {
    fprintf(stderr, "Cannot open %s: permission denied\n", output_file);
    exit(1);
  }
  if (classes == 0) {
    // Save the word vectors
    fprintf(fo, "%lld %lld\n", vocab_size, layer1_size);
    for (a = 0; a < vocab_size; a++) {
      if (vocab[a].word != NULL) {
        fprintf(fo, "%s ", vocab[a].word);
      }
      if (binary) for (b = 0; b < layer1_size; b++) fwrite(&syn0[a * layer1_size + b], sizeof(real), 1, fo);
      else for (b = 0; b < layer1_size; b++) fprintf(fo, "%lf ", syn0[a * layer1_size + b]);
      fprintf(fo, "\n");
    }

    // Save the classifier
    if (output_classifier && hs) {
      // append to the tree that was already output
      FILE * fhs = fopen(output_classifier, "ab");
      // output the layer
      for (a = 0; a < vocab_size; a++) {
        if (binary) {
          for (b = 0; b < layer1_size; b++) fwrite(&syn1[a * layer1_size + b], sizeof(real), 1, fhs);
        } else {
          for (b = 0; b < layer1_size; b++) fprintf(fhs, "%lf ", syn1[a * layer1_size + b]);
          fprintf(fhs, "\n");
        }
      }
      fclose(fhs);
    }
  } else {
    // Run K-means on the word vectors
    int clcn = classes, iter = 10, closeid;
    int *centcn = (int *)malloc(classes * sizeof(int));
    if (centcn == NULL) {
      fprintf(stderr, "cannot allocate memory for centcn\n");
      exit(1);
    }
    int *cl = (int *)calloc(vocab_size, sizeof(int));
    real closev, x;
    real *cent = (real *)calloc(classes * layer1_size, sizeof(real));
    for (a = 0; a < vocab_size; a++) cl[a] = a % clcn;
    for (a = 0; a < iter; a++) {
      for (b = 0; b < clcn * layer1_size; b++) cent[b] = 0;
      for (b = 0; b < clcn; b++) centcn[b] = 1;
      for (c = 0; c < vocab_size; c++) {
        for (d = 0; d < layer1_size; d++) cent[layer1_size * cl[c] + d] += syn0[c * layer1_size + d];
        centcn[cl[c]]++;
      }
      for (b = 0; b < clcn; b++) {
        closev = 0;
        for (c = 0; c < layer1_size; c++) {
          cent[layer1_size * b + c] /= centcn[b];
          closev += cent[layer1_size * b + c] * cent[layer1_size * b + c];
        }
        closev = sqrt(closev);
        for (c = 0; c < layer1_size; c++) cent[layer1_size * b + c] /= closev;
      }
      for (c = 0; c < vocab_size; c++) {
        closev = -10;
        closeid = 0;
        for (d = 0; d < clcn; d++) {
          x = 0;
          for (b = 0; b < layer1_size; b++) x += cent[layer1_size * d + b] * syn0[c * layer1_size + b];
          if (x > closev) {
            closev = x;
            closeid = d;
          }
        }
        cl[c] = closeid;
      }
    }
    // Save the K-means classes
    for (a = 0; a < vocab_size; a++) fprintf(fo, "%s %d\n", vocab[a].word, cl[a]);
    free(centcn);
    free(cent);
    free(cl);
  }
  fclose(fo);
  free(table);
  free(pt);
  DestroyVocab();
}